

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QGraphicsItemPrivate * __thiscall
QGraphicsItem::mapFromParent(QGraphicsItem *this,QPainterPath *path)

{
  QGraphicsItemPrivate *pQVar1;
  QPainterPath *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItemPrivate *this_00;
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RSI + 8));
  if (pQVar1->transformData == (TransformData *)0x0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RSI + 8));
    ::operator-((QPointF *)in_RDI);
    QPainterPath::translated(in_RSI,(QPointF *)this_00);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RSI + 8));
    QGraphicsItemPrivate::transformToParent(this_00);
    QTransform::inverted(local_58);
    QTransform::map((QPainterPath *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QGraphicsItem::mapFromParent(const QPainterPath &path) const
{
    // COMBINE
    if (!d_ptr->transformData)
            return path.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().map(path);
}